

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

void __thiscall
QMetaPropertyBuilder::setNotifySignal(QMetaPropertyBuilder *this,QMetaMethodBuilder *value)

{
  QMetaPropertyBuilderPrivate *pQVar1;
  long *in_RSI;
  QMetaPropertyBuilder *in_RDI;
  QMetaPropertyBuilderPrivate *d;
  
  pQVar1 = d_func(in_RDI);
  if (pQVar1 != (QMetaPropertyBuilderPrivate *)0x0) {
    if (*in_RSI == 0) {
      pQVar1->notifySignal = -1;
    }
    else {
      pQVar1->notifySignal = (int)in_RSI[1];
    }
  }
  return;
}

Assistant:

void QMetaPropertyBuilder::setNotifySignal(const QMetaMethodBuilder &value)
{
    QMetaPropertyBuilderPrivate *d = d_func();
    if (d) {
        if (value._mobj) {
            d->notifySignal = value._index;
        } else {
            d->notifySignal = -1;
        }
    }
}